

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O3

Span * __thiscall tcmalloc::PageHeap::AllocLarge(PageHeap *this,uint64_t n)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  long lVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  Span *span;
  
  p_Var4 = (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 == (_Base_ptr)0x0) {
LAB_00107c8c:
    span = (Span *)0x0;
  }
  else {
    p_Var1 = &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      lVar5 = 0x10;
      uVar2 = *(ulong *)(*(long *)(p_Var4 + 1) + 0x18);
      p_Var7 = p_Var4;
      if ((uVar2 <= n) && ((uVar2 < n || (*(long *)(*(long *)(p_Var4 + 1) + 0x10) == 0)))) {
        lVar5 = 0x18;
        p_Var7 = p_Var6;
      }
      p_Var4 = *(_Base_ptr *)((long)&p_Var4->_M_color + lVar5);
      p_Var6 = p_Var7;
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var7 == p_Var1) goto LAB_00107c8c;
    span = *(Span **)(p_Var7 + 1);
  }
  p_Var4 = (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 == (_Base_ptr)0x0) {
LAB_00107cf9:
    if (span == (Span *)0x0) {
      span = (Span *)0x0;
      goto LAB_00107d0e;
    }
  }
  else {
    p_Var1 = &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      lVar5 = 0x10;
      uVar2 = *(ulong *)(*(long *)(p_Var4 + 1) + 0x18);
      p_Var7 = p_Var4;
      if ((uVar2 <= n) && ((uVar2 < n || (*(long *)(*(long *)(p_Var4 + 1) + 0x10) == 0)))) {
        lVar5 = 0x18;
        p_Var7 = p_Var6;
      }
      p_Var4 = *(_Base_ptr *)((long)&p_Var4->_M_color + lVar5);
      p_Var6 = p_Var7;
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var7 == p_Var1) goto LAB_00107cf9;
    if (span == (Span *)0x0) {
      span = *(Span **)(p_Var7 + 1);
      goto LAB_00107cf9;
    }
    if ((*(Span **)(p_Var7 + 1))->npages < span->npages) {
      span = *(Span **)(p_Var7 + 1);
    }
  }
  RemoveFromFreeList(this,span);
LAB_00107d0e:
  bVar3 = CheckSmallList(this);
  if (!bVar3) {
    __assert_fail("CheckSmallList()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0xca,"Span *tcmalloc::PageHeap::AllocLarge(uint64_t)");
  }
  return span;
}

Assistant:

Span* AllocLarge(uint64_t n) {
        Span bound;
        bound.npages = n;
        bound.page_id = 0;
        Span* best = nullptr;

        auto it_normal = large_normal_.upper_bound(&bound);
        if (it_normal != large_normal_.end()) {
            best = *it_normal;
        }

        auto it_returned = large_returned_.upper_bound(&bound);
        if (it_returned != large_returned_.end()) {
            if (best == nullptr || best->npages > (*it_returned)->npages) {
                best = *it_returned;
            }
        }

        if (best != nullptr) {
            RemoveFromFreeList(best);
        }
        assert(CheckSmallList());
        return best;
    }